

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Result __thiscall
wabt::FileStream::MoveDataImpl(FileStream *this,size_t dst_offset,size_t src_offset,size_t size)

{
  size_t size_local;
  size_t src_offset_local;
  size_t dst_offset_local;
  FileStream *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (size == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    fprintf(_stderr,"%s:%d: FileStream::MoveDataImpl not implemented!\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/stream.cc",
            0x125);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result FileStream::MoveDataImpl(size_t dst_offset,
                                size_t src_offset,
                                size_t size) {
  if (!file_) {
    return Result::Error;
  }
  if (size == 0) {
    return Result::Ok;
  }
  // TODO(binji): implement if needed.
  ERROR0("FileStream::MoveDataImpl not implemented!\n");
  return Result::Error;
}